

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O2

string * __thiscall
setup::filename_map::lookup(string *__return_storage_ptr__,filename_map *this,string *key)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  pointer pcVar4;
  bool bVar5;
  iterator iVar6;
  char cVar7;
  size_type sVar8;
  size_type sVar9;
  
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  *)this,key);
  if ((_Rb_tree_header *)iVar6._M_node ==
      &(this->
       super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       )._M_t._M_impl.super__Rb_tree_header) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    sVar8 = key->_M_string_length;
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    pcVar2 = (key->_M_dataplus)._M_p;
    sVar3 = key->_M_string_length;
    pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
    for (sVar9 = 0; sVar3 != sVar9; sVar9 = sVar9 + 1) {
      cVar1 = pcVar2[sVar9];
      bVar5 = anon_unknown_0::is_unsafe_path_char::operator()
                        ((is_unsafe_path_char *)(ulong)(uint)(int)cVar1,(char)sVar8);
      cVar7 = '$';
      if (!bVar5) {
        cVar7 = cVar1;
      }
      pcVar4[sVar9] = cVar7;
    }
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(iVar6._M_node + 2));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string filename_map::lookup(const std::string & key) const {
	std::map<std::string, std::string>::const_iterator i = find(key);
	return (i == end()) ? replace_unsafe_chars(key) : i->second;
}